

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_1::verifyTextureLevelParameterEqual
               (CallLogWrapper *gl,GLenum target,int level,GLenum pname,int refValue,QueryType type)

{
  ostringstream *this;
  TestLog *log;
  bool bVar1;
  qpTestResult qVar2;
  QueriedState state;
  ResultCollector result;
  int local_25c;
  string local_258;
  QueriedState local_238;
  ResultCollector local_210;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::QueriedState::QueriedState(&local_238);
  log = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0," // ERROR: ",(allocator<char> *)&local_258);
  tcu::ResultCollector::ResultCollector(&local_210,log,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  local_1b0._0_8_ = gl->m_log;
  this = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"Verifying ");
  local_1c0.m_getName = glu::getTextureLevelParameterName;
  local_1c0.m_value = pname;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this);
  std::operator<<((ostream *)this,", expecting ");
  local_25c = refValue;
  de::toString<int>(&local_258,&local_25c);
  std::operator<<((ostream *)this,(string *)&local_258);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::ostringstream::~ostringstream(this);
  deqp::gls::StateQueryUtil::queryTextureLevelState
            (&local_210,gl,type,target,level,pname,&local_238);
  bVar1 = deqp::gls::StateQueryUtil::QueriedState::isUndefined(&local_238);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    deqp::gls::StateQueryUtil::verifyInteger(&local_210,&local_238,refValue);
    qVar2 = tcu::ResultCollector::getResult(&local_210);
    bVar1 = qVar2 == QP_TEST_RESULT_PASS;
  }
  tcu::ResultCollector::~ResultCollector(&local_210);
  return bVar1;
}

Assistant:

static bool verifyTextureLevelParameterEqual (glu::CallLogWrapper& gl, glw::GLenum target, int level, glw::GLenum pname, int refValue, QueryType type)
{
	return verifyTextureLevelParameterEqualWithPrinter<IntegerPrinter>(gl, target, level, pname, refValue, type);
}